

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int http_checkfile(char *urltype,char *infile,char *outfile1)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int status;
  int foundfile;
  int contentlength;
  char contenttype [1200];
  char contentencoding [1200];
  FILE *local_4e0;
  FILE *httpfile;
  char newinfile [1200];
  char *outfile1_local;
  char *infile_local;
  char *urltype_local;
  
  local_4e0 = (FILE *)0x0;
  bVar1 = false;
  newinfile._1192_8_ = outfile1;
  strcpy(urltype,"http://");
  sVar3 = strlen((char *)newinfile._1192_8_);
  if (sVar3 != 0) {
    iVar2 = strncmp((char *)newinfile._1192_8_,"file://",7);
    if (iVar2 == 0) {
      strcpy(netoutfile,(char *)(newinfile._1192_8_ + 7));
    }
    else {
      strcpy(netoutfile,(char *)newinfile._1192_8_);
    }
  }
  pcVar4 = strstr(infile,"?");
  if (pcVar4 != (char *)0x0) {
    sVar3 = strlen((char *)newinfile._1192_8_);
    if (sVar3 != 0) {
      strcpy(urltype,"httpfile://");
      iVar2 = strncmp((char *)newinfile._1192_8_,"file://",7);
      if (iVar2 == 0) {
        strcpy(netoutfile,(char *)(newinfile._1192_8_ + 7));
      }
      else {
        strcpy(netoutfile,(char *)newinfile._1192_8_);
      }
    }
    return 0;
  }
  pcVar4 = strstr(infile,".gz");
  if ((pcVar4 == (char *)0x0) && (pcVar4 = strstr(infile,".Z"), pcVar4 == (char *)0x0)) {
    sVar3 = strlen(infile);
    if (0x4af < sVar3 + 3) {
      return 0x7d;
    }
    strcpy((char *)&httpfile,infile);
    strcat((char *)&httpfile,".gz");
    iVar2 = http_open_network((char *)&httpfile,(FILE **)&local_4e0,contenttype + 0x4a8,
                              (char *)&foundfile,&status);
    if (iVar2 == 0) {
      iVar2 = strcmp(contenttype + 0x4a8,"ftp://");
      if (iVar2 == 0) {
        iVar2 = ftp_file_exist((char *)&httpfile);
        if (0 < iVar2) {
          strcpy(urltype,"ftp://");
          sVar3 = strlen((char *)&httpfile);
          if (sVar3 < 0x401) {
            strcpy(infile,(char *)&httpfile);
            sVar3 = strlen((char *)newinfile._1192_8_);
            if (sVar3 != 0) {
              iVar2 = strncmp((char *)newinfile._1192_8_,"mem:",4);
              if (iVar2 == 0) {
                strcpy(urltype,"ftpmem://");
              }
              else {
                pcVar4 = strstr((char *)newinfile._1192_8_,".gz");
                if ((pcVar4 == (char *)0x0) &&
                   (pcVar4 = strstr((char *)newinfile._1192_8_,".Z"), pcVar4 == (char *)0x0)) {
                  strcpy(urltype,"ftpfile://");
                }
                else {
                  strcpy(urltype,"ftpcompress://");
                }
              }
            }
            return 0;
          }
          return 0x7d;
        }
      }
      else {
        iVar2 = strcmp(contenttype + 0x4a8,"https://");
        if (iVar2 == 0) {
          https_checkfile(urltype,infile,(char *)newinfile._1192_8_);
          return 0;
        }
        if (local_4e0 != (FILE *)0x0) {
          fclose(local_4e0);
        }
        bVar1 = true;
        sVar3 = strlen((char *)&httpfile);
        if (0x400 < sVar3) {
          return 0x7d;
        }
        strcpy(infile,(char *)&httpfile);
      }
    }
    else if (iVar2 != 0x68) {
      return iVar2;
    }
    if (!bVar1) {
      sVar3 = strlen(infile + 2);
      if (0x4af < sVar3) {
        return 0x7d;
      }
      strcpy((char *)&httpfile,infile);
      strcat((char *)&httpfile,".Z");
      iVar2 = http_open_network((char *)&httpfile,(FILE **)&local_4e0,contenttype + 0x4a8,
                                (char *)&foundfile,&status);
      if (iVar2 == 0) {
        iVar2 = strcmp(contenttype + 0x4a8,"ftp://");
        if (iVar2 == 0) {
          iVar2 = ftp_file_exist((char *)&httpfile);
          if (0 < iVar2) {
            strcpy(urltype,"ftp://");
            sVar3 = strlen((char *)&httpfile);
            if (sVar3 < 0x401) {
              strcpy(infile,(char *)&httpfile);
              sVar3 = strlen((char *)newinfile._1192_8_);
              if (sVar3 != 0) {
                iVar2 = strncmp((char *)newinfile._1192_8_,"mem:",4);
                if (iVar2 == 0) {
                  strcpy(urltype,"ftpmem://");
                }
                else {
                  pcVar4 = strstr((char *)newinfile._1192_8_,".gz");
                  if ((pcVar4 == (char *)0x0) &&
                     (pcVar4 = strstr((char *)newinfile._1192_8_,".Z"), pcVar4 == (char *)0x0)) {
                    strcpy(urltype,"ftpfile://");
                  }
                  else {
                    strcpy(urltype,"ftpcompress://");
                  }
                }
              }
              return 0;
            }
            return 0x7d;
          }
        }
        else {
          if (local_4e0 != (FILE *)0x0) {
            fclose(local_4e0);
          }
          bVar1 = true;
          sVar3 = strlen((char *)&httpfile);
          if (0x400 < sVar3) {
            return 0x7d;
          }
          strcpy(infile,(char *)&httpfile);
        }
      }
    }
  }
  if (!bVar1) {
    strcpy((char *)&httpfile,infile);
    iVar2 = http_open_network((char *)&httpfile,(FILE **)&local_4e0,contenttype + 0x4a8,
                              (char *)&foundfile,&status);
    if (iVar2 == 0) {
      iVar2 = strcmp(contenttype + 0x4a8,"ftp://");
      if (iVar2 == 0) {
        iVar2 = ftp_file_exist((char *)&httpfile);
        if (0 < iVar2) {
          strcpy(urltype,"ftp://");
          sVar3 = strlen((char *)&httpfile);
          if (0x400 < sVar3) {
            return 0x7d;
          }
          strcpy(infile,(char *)&httpfile);
          sVar3 = strlen((char *)newinfile._1192_8_);
          if (sVar3 != 0) {
            iVar2 = strncmp((char *)newinfile._1192_8_,"mem:",4);
            if (iVar2 == 0) {
              strcpy(urltype,"ftpmem://");
              return 0;
            }
            strcpy(urltype,"ftpfile://");
          }
          return 0;
        }
      }
      else {
        iVar2 = strcmp(contenttype + 0x4a8,"https://");
        if (iVar2 == 0) {
          https_checkfile(urltype,infile,(char *)newinfile._1192_8_);
          return 0;
        }
        if (local_4e0 != (FILE *)0x0) {
          fclose(local_4e0);
        }
        bVar1 = true;
        sVar3 = strlen((char *)&httpfile);
        if (0x400 < sVar3) {
          return 0x7d;
        }
        strcpy(infile,(char *)&httpfile);
      }
    }
  }
  if (!bVar1) {
    return 0x68;
  }
  sVar3 = strlen((char *)newinfile._1192_8_);
  if (sVar3 != 0) {
    iVar2 = strncmp((char *)newinfile._1192_8_,"mem:",4);
    if (iVar2 == 0) {
      strcpy(urltype,"httpmem://");
      return 0;
    }
    pcVar4 = strstr(infile,"?");
    if (pcVar4 != (char *)0x0) {
      strcpy(urltype,"httpfile://");
      return 0;
    }
    pcVar4 = strstr(infile,".gz");
    if ((pcVar4 == (char *)0x0) && (pcVar4 = strstr(infile,".Z"), pcVar4 == (char *)0x0)) {
      strcpy(urltype,"httpfile://");
    }
    else {
      pcVar4 = strstr((char *)newinfile._1192_8_,".gz");
      if ((pcVar4 == (char *)0x0) &&
         (pcVar4 = strstr((char *)newinfile._1192_8_,".Z"), pcVar4 == (char *)0x0)) {
        strcpy(urltype,"httpfile://");
      }
      else {
        strcpy(urltype,"httpcompress://");
      }
    }
  }
  return 0;
}

Assistant:

int http_checkfile (char *urltype, char *infile, char *outfile1)
{

/* Small helper functions to set the netoutfile static string */
/* Called by cfileio after parsing the output file off of the input file url */

  char newinfile[MAXLEN];
  FILE *httpfile=0;
  char contentencoding[MAXLEN], contenttype[MAXLEN];
  int contentlength;
  int foundfile = 0;
  int status=0;

  /* set defaults  */
  strcpy(urltype,"http://");

  if (strlen(outfile1)) {
    /* don't copy the "file://" prefix, if present.  */
    if (!strncmp(outfile1, "file://", 7) ) {
      strcpy(netoutfile,outfile1+7);
    } else {
      strcpy(netoutfile,outfile1);
    }
  }

  if (strstr(infile, "?")) {
      /* Special case where infile name contains a "?". */
      /* This is probably a CGI string; no point in testing if it exists */
      /*  so just set urltype and netoutfile if necessary, then return */
      
      if (strlen(outfile1)) {   /* was an outfile specified? */
          strcpy(urltype,"httpfile://");  

          /* don't copy the "file://" prefix, if present.  */
          if (!strncmp(outfile1, "file://", 7) ) {
             strcpy(netoutfile,outfile1+7);
          } else {
             strcpy(netoutfile,outfile1);
          }
      }
      return 0;  /* case where infile name contains "?" */
  }

  /*
     If the specified infile file name does not contain a .gz or .Z suffix,
     then first test if a .gz compressed version of the file exists, and if not
     then test if a .Z version of the file exists. (because it will be much
     faster to read the compressed file).  If the compressed files do not exist,
     then finally just open the infile name exactly as specified.
  */

  if (!strstr(infile,".gz") && (!strstr(infile,".Z"))) {
    /* The infile string does not contain the name of a compressed file.  */
    /* Fisrt, look for a .gz compressed version of the file. */
    
    if (strlen(infile) + 3 > MAXLEN-1)
    {
       return URL_PARSE_ERROR;
    }  
    strcpy(newinfile,infile);
    strcat(newinfile,".gz");

    status = http_open_network(newinfile,&httpfile, contentencoding,
			       contenttype, &contentlength);
    if (!status) {
      if (!strcmp(contentencoding, "ftp://")) {
          /* this is a signal from http_open_network that indicates that */
          /* the http server returned a 301 or 302 redirect to a FTP URL. */
          /* Check that the file exists, because redirect many not be reliable */
	   
          if (ftp_file_exist(newinfile)>0) { 
              /* The ftp .gz compressed file is there, all is good!  */
              strcpy(urltype, "ftp://");
              if (strlen(newinfile) > FLEN_FILENAME-1)
              {
                 return URL_PARSE_ERROR;
              }
              strcpy(infile,newinfile);

              if (strlen(outfile1)) {
                /* there is an output file;  might need to modify the urltype */

                if (!strncmp(outfile1, "mem:", 4) )  {
                     /* copy the file to memory, with READ and WRITE access 
                     In this case, it makes no difference whether the ftp file
                     and or the output file are compressed or not.   */

                     strcpy(urltype, "ftpmem://");  /* use special driver */
                } else {
        	    /* input file is compressed */
		    if (strstr(outfile1,".gz") || (strstr(outfile1,".Z"))) {
		      strcpy(urltype,"ftpcompress://");
		    } else {
		      strcpy(urltype,"ftpfile://");
		    }
                } 
              }

              return 0;   /* found the .gz compressed ftp file */
	    }
            /* fall through to here if ftp redirect does not exist */
      } else if (!strcmp(contentencoding, "https://")) {
          /* the http server returned a 301 or 302 redirect to an HTTPS URL. */
          https_checkfile(urltype, infile, outfile1);
          /* For https we're not testing for compressed extensions at 
             this stage.  It will all be done in https_open_network.  Therefore
             leave infile alone and do immediate return. */
          return 0;
      } else {
          /* found the http .gz compressed file */
          if (httpfile)
             fclose(httpfile);
          foundfile = 1;
          if (strlen(newinfile) > FLEN_FILENAME-1)
          {
             return URL_PARSE_ERROR;
          }
          strcpy(infile,newinfile);
      }
    }
    else if (status != FILE_NOT_OPENED)
    {
       /* Some other error occured aside from not finding file, such as
          a url parsing error.  Don't continue trying with other extensions. */
       return status;   
    }

   if (!foundfile) {
    /* did not find .gz compressed version of the file, so look for .Z file. */
    
    if (strlen(infile+2) > MAXLEN-1)
    {
       return URL_PARSE_ERROR;
    }  
    strcpy(newinfile,infile);
    strcat(newinfile,".Z");
    if (!http_open_network(newinfile,&httpfile, contentencoding,
			   contenttype, &contentlength)) {

      if (!strcmp(contentencoding, "ftp://")) {
          /* this is a signal from http_open_network that indicates that */
          /* the http server returned a 301 or 302 redirect to a FTP URL. */
          /* Check that the file exists, because redirect many not be reliable */
	   
          if (ftp_file_exist(newinfile)>0) { 
              /* The ftp .Z compressed file is there, all is good!  */
              strcpy(urltype, "ftp://");
              if (strlen(newinfile) > FLEN_FILENAME-1)
              {
                 return URL_PARSE_ERROR;
              }
              strcpy(infile,newinfile);

              if (strlen(outfile1)) {
                /* there is an output file;  might need to modify the urltype */

                if (!strncmp(outfile1, "mem:", 4) )  {
                     /* copy the file to memory, with READ and WRITE access 
                     In this case, it makes no difference whether the ftp file
                     and or the output file are compressed or not.   */

                     strcpy(urltype, "ftpmem://");  /* use special driver */
                } else {
        	    /* input file is compressed */
		    if (strstr(outfile1,".gz") || (strstr(outfile1,".Z"))) {
		      strcpy(urltype,"ftpcompress://");
		    } else {
		      strcpy(urltype,"ftpfile://");
		    }
                } 
            }
            return 0;   /* found the .Z compressed ftp file */
          }
          /* fall through to here if ftp redirect does not exist */
        }  else {
           /* found the http .Z compressed file */
           if (httpfile)
              fclose(httpfile);
           foundfile = 1;
           if (strlen(newinfile) > FLEN_FILENAME-1)
           {
              return URL_PARSE_ERROR;
           }
           strcpy(infile,newinfile);
        }
      }
    }
  }  /* end of case where infile does not contain .gz or .Z */

  if (!foundfile) {
    /* look for the base file.name */
      
    strcpy(newinfile,infile);
    if (!http_open_network(newinfile,&httpfile, contentencoding,
			   contenttype, &contentlength)) {

      if (!strcmp(contentencoding, "ftp://")) {
          /* this is a signal from http_open_network that indicates that */
          /* the http server returned a 301 or 302 redirect to a FTP URL. */
          /* Check that the file exists, because redirect many not be reliable */
	   
          if (ftp_file_exist(newinfile)>0) { 
              /* The ftp file is there, all is good!  */
              strcpy(urltype, "ftp://");
              if (strlen(newinfile) > FLEN_FILENAME-1)
              {
                 return URL_PARSE_ERROR;
              }
              strcpy(infile,newinfile);

              if (strlen(outfile1)) {
                /* there is an output file;  might need to modify the urltype */

                if (!strncmp(outfile1, "mem:", 4) )  {
                     /* copy the file to memory, with READ and WRITE access 
                     In this case, it makes no difference whether the ftp file
                     and or the output file are compressed or not.   */

                     strcpy(urltype, "ftpmem://");  /* use special driver */
                     return 0;
                } else {

        	  /* input file is not compressed */
		   strcpy(urltype,"ftpfile://");
                } 
              } 
              return 0;   /* found the ftp file */
            }
            /* fall through to here if ftp redirect does not exist */
      } else if (!strcmp(contentencoding, "https://")) {
          /* the http server returned a 301 or 302 redirect to an HTTPS URL. */
          https_checkfile(urltype, infile, outfile1);
          /* For https we're not testing for compressed extensions at 
             this stage.  It will all be done in https_open_network.  Therefore
             leave infile alone and do immediate return. */
          return 0;
      }  else {
          /* found the base named file */
          if (httpfile)
             fclose(httpfile);
          foundfile = 1;
          if (strlen(newinfile) > FLEN_FILENAME-1)
          {
             return URL_PARSE_ERROR;
          }
          strcpy(infile,newinfile);
      }

    }
  }

  if (!foundfile) {
     return (FILE_NOT_OPENED);
  }

  if (strlen(outfile1)) {
    /* there is an output file */

    if (!strncmp(outfile1, "mem:", 4) )  {
       /* copy the file to memory, with READ and WRITE access 
          In this case, it makes no difference whether the http file
          and or the output file are compressed or not.   */

       strcpy(urltype, "httpmem://");  /* use special driver */
       return 0;
    }

    if (strstr(infile, "?")) {
      /* file name contains a '?' so probably a cgi string;  */
      strcpy(urltype,"httpfile://");
      return 0;
    }

    if (strstr(infile,".gz") || (strstr(infile,".Z"))) {
	/* It's compressed */
	if (strstr(outfile1,".gz") || (strstr(outfile1,".Z"))) {
	  strcpy(urltype,"httpcompress://");
	} else {
	  strcpy(urltype,"httpfile://");
	}
    } else {
	strcpy(urltype,"httpfile://");
    }
  } 
  return 0;
}